

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedTestTest.cpp
# Opt level: O1

void __thiscall
TEST_TestOrderedTest_TwoTestsAddedInReverseOrder_Test::testBody
          (TEST_TestOrderedTest_TwoTestsAddedInReverseOrder_Test *this)

{
  OrderedTestShell *test;
  OrderedTestShell *test_00;
  int iVar1;
  UtestShell *pUVar2;
  TestRegistry *pTVar3;
  undefined4 extraout_var;
  TestTerminator *pTVar4;
  undefined4 extraout_var_00;
  undefined1 *puVar5;
  OrderedTestInstaller local_38;
  
  test = &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest;
  OrderedTestInstaller::OrderedTestInstaller
            (&local_38,test,"testgroup","testname",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x40,5);
  OrderedTestInstaller::~OrderedTestInstaller(&local_38);
  test_00 = &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest2;
  OrderedTestInstaller::OrderedTestInstaller
            (&local_38,test_00,"testgroup","testname",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x40,3);
  OrderedTestInstaller::~OrderedTestInstaller(&local_38);
  pUVar2 = UtestShell::getCurrent();
  pTVar3 = TestTestingFixture::getRegistry
                     ((this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).fixture);
  iVar1 = (*pTVar3->_vptr_TestRegistry[0x13])(pTVar3);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((OrderedTestShell *)CONCAT44(extraout_var,iVar1) == test_00),"CHECK",
             "firstTest() == &orderedTest2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x6f,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  pTVar3 = TestTestingFixture::getRegistry
                     ((this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).fixture);
  iVar1 = (*pTVar3->_vptr_TestRegistry[0x13])(pTVar3);
  puVar5 = (undefined1 *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x18))
                     ((long *)CONCAT44(extraout_var_00,iVar1));
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((OrderedTestShell *)puVar5 == test),"CHECK",
             "secondTest() == &orderedTest",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x70,pTVar4);
  return;
}

Assistant:

TEST(TestOrderedTest, TwoTestsAddedInReverseOrder)
{
    InstallOrderedTest(orderedTest, 5);
    InstallOrderedTest(orderedTest2, 3);
    CHECK(firstTest() == &orderedTest2);
    CHECK(secondTest() == &orderedTest);
}